

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptivescannero1.cpp
# Opt level: O2

void __thiscall
AdaptiveScannerO1::AdaptiveScannerO1
          (AdaptiveScannerO1 *this,int xmin,int ymin,int xmax,int ymax,int a,int b,int nbs,
          bool *steps,int cx,int cy,int length)

{
  bool *pbVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  bool *pbVar9;
  bool *pbVar10;
  
  (this->super_DirectionalScanner).xmin = xmin;
  (this->super_DirectionalScanner).ymin = ymin;
  (this->super_DirectionalScanner).xmax = xmax;
  (this->super_DirectionalScanner).ymax = ymax;
  (this->super_DirectionalScanner).nbs = nbs;
  (this->super_DirectionalScanner).steps = steps;
  (this->super_DirectionalScanner).ccx = cx;
  (this->super_DirectionalScanner).ccy = cy;
  (this->super_DirectionalScanner).lcx = cx;
  (this->super_DirectionalScanner).lcy = cy;
  (this->super_DirectionalScanner).clearance = true;
  (this->super_DirectionalScanner)._vptr_DirectionalScanner =
       (_func_int **)&PTR__DirectionalScanner_0014e468;
  (this->super_DirectionalScanner).dla = a;
  (this->super_DirectionalScanner).dlb = b;
  pbVar1 = steps + nbs;
  (this->super_DirectionalScanner).fs = pbVar1;
  uVar2 = (long)(length + 1) / 2;
  uVar3 = uVar2 & 0xffffffff;
  iVar4 = 0;
  uVar6 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar6 = 0;
  }
  pbVar10 = pbVar1;
  iVar5 = cy;
  iVar7 = cx;
  while (iVar8 = (int)uVar6, uVar6 = (ulong)(iVar8 - 1), iVar8 != 0) {
    pbVar9 = pbVar10 + -1;
    if (pbVar10 + -1 < steps) {
      pbVar9 = steps + (long)nbs + -1;
      pbVar10 = pbVar1;
    }
    if (pbVar10[-1] == true) {
      iVar7 = iVar7 + 1;
      (this->super_DirectionalScanner).lcx = iVar7;
    }
    iVar5 = iVar5 + -1;
    (this->super_DirectionalScanner).lcy = iVar5;
    iVar4 = iVar4 + b;
    pbVar10 = pbVar9;
  }
  this->dlc1 = (iVar7 * a + cy * b) - iVar4;
  (this->super_DirectionalScanner).lst2 = pbVar10;
  (this->super_DirectionalScanner).rst2 = pbVar10;
  iVar8 = -(cy * b);
  pbVar10 = steps;
  while (0 < (int)uVar3) {
    uVar3 = (ulong)((int)uVar3 - 1);
    cx = cx - (uint)*pbVar10;
    pbVar10 = pbVar10 + 1;
    if (pbVar1 <= pbVar10) {
      pbVar10 = steps;
    }
    iVar4 = iVar4 + b;
    iVar8 = iVar8 - b;
  }
  (this->super_DirectionalScanner).dlc2 = cx * a - iVar8;
  *(int *)&(this->super_DirectionalScanner).field_0x64 = a;
  this->templ_b = b;
  this->templ_nu = (iVar7 - cx) * a - iVar4;
  (this->super_DirectionalScanner).rcx = iVar7;
  (this->super_DirectionalScanner).rcy = iVar5;
  return;
}

Assistant:

AdaptiveScannerO1::AdaptiveScannerO1 (
                          int xmin, int ymin, int xmax, int ymax,
                          int a, int b,
                          int nbs, bool *steps, int cx, int cy, int length)
                    : DirectionalScanner (xmin, ymin, xmax, ymax,
                                          nbs, steps, cx, cy)
{
  this->dla = a;
  this->dlb = b;
  fs = steps + nbs;
  int w_2 = (length + 1) / 2;

  // Looking for the central scan start position
  bool *st = steps + nbs;
  for (int i = 0; i < w_2; i++)
  {
    if (--st < steps) st = steps + nbs - 1;
    if (*st) lcx ++;
    lcy --;
  }
  dlc1 = dla * lcx + dlb * lcy;
  lst2 = st;
  rst2 = st;

  // Looking for the upper leaning line
  st = steps;
  while (w_2-- > 0)
  {
    if (*st) cx--;
    cy++;
    if (++st >= fs) st = steps;
  }
  dlc2 = dla * cx + dlb * cy;

  this->templ_a = a;
  this->templ_b = b;
  this->templ_nu = this->dlc1 - this->dlc2;

  rcx = lcx;
  rcy = lcy;
}